

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

void icu_63::number::impl::blueprint_helpers::generateIntegerWidthOption
               (int32_t minInt,int32_t maxInt,UnicodeString *sb,UErrorCode *param_4)

{
  int iVar1;
  UChar local_1a;
  
  if (maxInt == -1) {
    local_1a = L'+';
    UnicodeString::doAppend(sb,&local_1a,0,1);
  }
  else {
    iVar1 = maxInt - minInt;
    if (iVar1 != 0 && minInt <= maxInt) {
      do {
        UnicodeString::append(sb,0x23);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  if (0 < minInt) {
    do {
      UnicodeString::append(sb,0x30);
      minInt = minInt + -1;
    } while (minInt != 0);
  }
  return;
}

Assistant:

void blueprint_helpers::generateIntegerWidthOption(int32_t minInt, int32_t maxInt, UnicodeString& sb,
                                                   UErrorCode&) {
    if (maxInt == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxInt - minInt);
    }
    appendMultiple(sb, u'0', minInt);
}